

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O0

void __thiscall
adios2::transport::ShmSystemV::Read(ShmSystemV *this,char *buffer,size_t size,size_t start)

{
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  string *in_stack_00000108;
  size_t in_stack_00000110;
  size_t in_stack_00000118;
  ShmSystemV *in_stack_00000120;
  string *in_stack_ffffffffffffff28;
  string *process;
  Transport *this_00;
  undefined1 local_a1 [40];
  undefined1 local_79 [56];
  allocator local_41;
  string local_40 [40];
  size_t local_18;
  void *local_10;
  
  local_40._32_8_ = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"in call to Read",&local_41);
  CheckSizes(in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = (Transport *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_79 + 1),"read",(allocator *)this_00);
  Transport::ProfilerStart(this_00,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  memcpy(local_10,(void *)(*(long *)(in_RDI + 0x118) + local_40._32_8_),local_18);
  process = (string *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a1 + 1),"read",(allocator *)process);
  Transport::ProfilerStop(this_00,process);
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  return;
}

Assistant:

void ShmSystemV::Read(char *buffer, size_t size, size_t start)
{
    CheckSizes(size, start, "in call to Read");
    ProfilerStart("read");
    std::memcpy(buffer, &m_Buffer[start], size);
    ProfilerStop("read");
}